

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::ensureVolumeInspectValid(SlicePlane *this)

{
  bool bVar1;
  byte bVar2;
  long in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  string *this_00;
  string local_28 [24];
  string *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
    this_00 = local_28;
    std::__cxx11::string::string(this_00,(string *)(in_RDI + 0x1b0));
    bVar1 = hasVolumeMesh(in_stack_fffffffffffffff0);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_28);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x1b0),"");
      *(undefined1 *)(in_RDI + 0x1a8) = 0;
      std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
                ((shared_ptr<polyscope::render::ShaderProgram> *)this_00,
                 (nullptr_t)CONCAT17(bVar2,in_stack_ffffffffffffff98));
      std::shared_ptr<polyscope::render::ShaderProgram>::operator=
                ((shared_ptr<polyscope::render::ShaderProgram> *)this_00,
                 (shared_ptr<polyscope::render::ShaderProgram> *)
                 CONCAT17(bVar2,in_stack_ffffffffffffff98));
      std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
                ((shared_ptr<polyscope::render::ShaderProgram> *)0x460d6c);
    }
  }
  return;
}

Assistant:

void SlicePlane::ensureVolumeInspectValid() {
  if (!shouldInspectMesh) return;

  // This method exists to save us in any cases where we might be inspecting a volume mesh when that mesh is deleted. We
  // can't just call setVolumeMeshToInspect(""), because that tries to look up the volume mesh.

  if (!hasVolumeMesh(inspectedMeshName)) {
    inspectedMeshName = "";
    shouldInspectMesh = false;
    volumeInspectProgram = nullptr;
  }
}